

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Embedding.h
# Opt level: O0

void __thiscall
Embedding<float>::backward
          (Embedding<float> *this,SentenceView *sentView,Vector<float> *grad,float lr,int cbow)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  int iVar5;
  int iVar6;
  int local_40;
  int local_3c;
  int i_1;
  int i;
  int j;
  int C;
  int base;
  int idx;
  int cbow_local;
  float lr_local;
  Vector<float> *grad_local;
  SentenceView *sentView_local;
  Embedding<float> *this_local;
  
  if (cbow == 0) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (sentView->sent,(long)sentView->central);
    iVar1 = *pvVar4;
    iVar2 = this->embeddingSize;
    for (local_40 = 0; local_40 < this->embeddingSize; local_40 = local_40 + 1) {
      iVar6 = iVar2 * iVar1 + local_40;
      this->matrix[iVar6] = -lr * grad->base[local_40] + this->matrix[iVar6];
    }
  }
  else {
    iVar1 = sentView->right;
    iVar2 = sentView->left;
    for (i_1 = sentView->left; i_1 < sentView->right; i_1 = i_1 + 1) {
      if (i_1 != sentView->central) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](sentView->sent,(long)i_1);
        iVar6 = *pvVar4;
        iVar3 = this->embeddingSize;
        for (local_3c = 0; local_3c < this->embeddingSize; local_3c = local_3c + 1) {
          iVar5 = iVar3 * iVar6 + local_3c;
          this->matrix[iVar5] =
               this->matrix[iVar5] - (lr * grad->base[local_3c]) / (float)((iVar1 - iVar2) + -1);
        }
      }
    }
  }
  return;
}

Assistant:

void Embedding<T>::backward(SentenceView &sentView, Vector<T> &grad, T lr, int cbow)
{
    int idx, base;
    if (cbow)
    {
        int C = sentView.right - sentView.left - 1;
        for (int j = sentView.left; j < sentView.right; j++)
        {
            if (j == sentView.central)
                continue;
            idx = sentView.sent[j];
            base = embeddingSize * idx;
            for (int i = 0; i < embeddingSize; i++)
                matrix[base + i] -= lr * grad.base[i] / C;
        }
    } else
    {
        idx = sentView.sent[sentView.central];
        base = embeddingSize * idx;
        for (int i = 0; i < embeddingSize; i++)
            matrix[base + i] -= lr * grad.base[i];
    }
}